

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetlinecontrol.cpp
# Opt level: O2

void __thiscall QWidgetLineControl::parseInputMask(QWidgetLineControl *this,QString *maskFields)

{
  QWidgetLineControl *this_00;
  short sVar1;
  qsizetype qVar2;
  pointer pMVar3;
  char16_t *pcVar4;
  Data *__p;
  char16_t cVar5;
  qsizetype n;
  type pMVar6;
  int i;
  long lVar7;
  ulong uVar8;
  bool bVar9;
  int iVar10;
  bool bVar11;
  int i_1;
  ulong uVar12;
  size_t __i;
  long in_FS_OFFSET;
  Casemode local_64;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  n = QString::indexOf(maskFields,(QChar)0x3b,0,CaseSensitive);
  if ((n == 0) || ((maskFields->d).size == 0)) {
    if (*(long *)(this + 0xe8) != 0) {
      std::
      __uniq_ptr_impl<QWidgetLineControl::MaskInputData,_std::default_delete<QWidgetLineControl::MaskInputData[]>_>
      ::reset((__uniq_ptr_impl<QWidgetLineControl::MaskInputData,_std::default_delete<QWidgetLineControl::MaskInputData[]>_>
               *)(this + 0xe8),(pointer)0x0);
      *(undefined4 *)(this + 0x60) = 0x7fff;
      local_58.d = (Data *)0x0;
      local_58.ptr = (char16_t *)0x0;
      local_58.size = 0;
      internalSetText(this,(QString *)&local_58,-1,false);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    }
  }
  else {
    if (n == -1) {
      *(undefined2 *)(this + 0xe0) = 0x20;
      QString::operator=((QString *)(this + 200),(QString *)maskFields);
    }
    else {
      QString::left((QString *)&local_58,maskFields,n);
      pMVar3 = *(pointer *)(this + 200);
      pcVar4 = *(char16_t **)(this + 0xd0);
      *(Data **)(this + 200) = local_58.d;
      *(char16_t **)(this + 0xd0) = local_58.ptr;
      qVar2 = *(qsizetype *)(this + 0xd8);
      *(qsizetype *)(this + 0xd8) = local_58.size;
      local_58.d = (Data *)pMVar3;
      local_58.ptr = pcVar4;
      local_58.size = qVar2;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
      cVar5 = L' ';
      if (n + 1 < (maskFields->d).size) {
        cVar5 = (maskFields->d).ptr[n + 1];
      }
      *(char16_t *)(this + 0xe0) = cVar5;
    }
    *(undefined4 *)(this + 0x60) = 0;
    iVar10 = 0;
    bVar11 = false;
    for (lVar7 = 0; *(long *)(this + 0xd8) != lVar7; lVar7 = lVar7 + 1) {
      if (bVar11) {
LAB_003f78b7:
        iVar10 = iVar10 + 1;
        *(int *)(this + 0x60) = iVar10;
LAB_003f78bc:
        bVar11 = false;
      }
      else {
        sVar1 = *(short *)(*(long *)(this + 0xd0) + lVar7 * 2);
        if ((((sVar1 == 0x21) || (sVar1 == 0x3c)) || (sVar1 == 0x3e)) || (sVar1 == 0x5b))
        goto LAB_003f78bc;
        if (sVar1 != 0x5c) {
          if (((sVar1 != 0x5d) && (sVar1 != 0x7b)) && (sVar1 != 0x7d)) goto LAB_003f78b7;
          goto LAB_003f78bc;
        }
        bVar11 = true;
      }
    }
    std::make_unique<QWidgetLineControl::MaskInputData[]>((size_t)&local_58);
    __p = local_58.d;
    this_00 = this + 0xe8;
    local_58.d = (Data *)0x0;
    std::
    __uniq_ptr_impl<QWidgetLineControl::MaskInputData,_std::default_delete<QWidgetLineControl::MaskInputData[]>_>
    ::reset((__uniq_ptr_impl<QWidgetLineControl::MaskInputData,_std::default_delete<QWidgetLineControl::MaskInputData[]>_>
             *)this_00,(pointer)__p);
    std::
    unique_ptr<QWidgetLineControl::MaskInputData[],_std::default_delete<QWidgetLineControl::MaskInputData[]>_>
    ::~unique_ptr((unique_ptr<QWidgetLineControl::MaskInputData[],_std::default_delete<QWidgetLineControl::MaskInputData[]>_>
                   *)&local_58);
    local_64 = NoCaseMode;
    bVar11 = false;
    iVar10 = 0;
    for (uVar12 = 0; uVar12 < *(ulong *)(this + 0xd8); uVar12 = uVar12 + 1) {
      cVar5 = *(char16_t *)(*(long *)(this + 0xd0) + uVar12 * 2);
      __i = (size_t)iVar10;
      if (bVar11) {
        pMVar6 = std::
                 unique_ptr<QWidgetLineControl::MaskInputData[],_std::default_delete<QWidgetLineControl::MaskInputData[]>_>
                 ::operator[]((unique_ptr<QWidgetLineControl::MaskInputData[],_std::default_delete<QWidgetLineControl::MaskInputData[]>_>
                               *)this_00,__i);
        (pMVar6->maskChar).ucs = cVar5;
        pMVar6 = std::
                 unique_ptr<QWidgetLineControl::MaskInputData[],_std::default_delete<QWidgetLineControl::MaskInputData[]>_>
                 ::operator[]((unique_ptr<QWidgetLineControl::MaskInputData[],_std::default_delete<QWidgetLineControl::MaskInputData[]>_>
                               *)this_00,__i);
        pMVar6->separator = true;
        pMVar6 = std::
                 unique_ptr<QWidgetLineControl::MaskInputData[],_std::default_delete<QWidgetLineControl::MaskInputData[]>_>
                 ::operator[]((unique_ptr<QWidgetLineControl::MaskInputData[],_std::default_delete<QWidgetLineControl::MaskInputData[]>_>
                               *)this_00,__i);
        pMVar6->caseMode = local_64;
        iVar10 = iVar10 + 1;
        bVar11 = false;
      }
      else {
        bVar9 = false;
        uVar8 = (ulong)((ushort)cVar5 - 0x23);
        if ((ushort)cVar5 - 0x23 < 0x36) {
          if ((0x200822c0402001U >> (uVar8 & 0x3f) & 1) != 0) goto switchD_003f79b8_caseD_61;
          if (uVar8 == 0x19) {
            local_64 = Lower;
          }
          else {
            if (uVar8 != 0x1b) goto code_r0x003f79aa;
            local_64 = Upper;
          }
        }
        else {
code_r0x003f79aa:
          bVar9 = false;
          switch(cVar5) {
          case L'[':
          case L']':
            break;
          case L'\\':
            bVar11 = true;
            break;
          case L'^':
          case L'_':
          case L'`':
          case L'c':
          case L'e':
          case L'f':
          case L'g':
          case L'i':
          case L'j':
          case L'k':
          case L'l':
          case L'm':
switchD_003f79b8_caseD_5e:
            bVar9 = true;
          case L'a':
          case L'b':
          case L'd':
          case L'h':
          case L'n':
switchD_003f79b8_caseD_61:
            pMVar6 = std::
                     unique_ptr<QWidgetLineControl::MaskInputData[],_std::default_delete<QWidgetLineControl::MaskInputData[]>_>
                     ::operator[]((unique_ptr<QWidgetLineControl::MaskInputData[],_std::default_delete<QWidgetLineControl::MaskInputData[]>_>
                                   *)this_00,__i);
            (pMVar6->maskChar).ucs = cVar5;
            pMVar6 = std::
                     unique_ptr<QWidgetLineControl::MaskInputData[],_std::default_delete<QWidgetLineControl::MaskInputData[]>_>
                     ::operator[]((unique_ptr<QWidgetLineControl::MaskInputData[],_std::default_delete<QWidgetLineControl::MaskInputData[]>_>
                                   *)this_00,__i);
            pMVar6->separator = bVar9;
            pMVar6 = std::
                     unique_ptr<QWidgetLineControl::MaskInputData[],_std::default_delete<QWidgetLineControl::MaskInputData[]>_>
                     ::operator[]((unique_ptr<QWidgetLineControl::MaskInputData[],_std::default_delete<QWidgetLineControl::MaskInputData[]>_>
                                   *)this_00,__i);
            pMVar6->caseMode = local_64;
            iVar10 = iVar10 + 1;
            break;
          default:
            if (cVar5 == L'!') {
              local_64 = NoCaseMode;
            }
            else {
              bVar9 = false;
              if (cVar5 == L'x') goto switchD_003f79b8_caseD_61;
              if ((cVar5 != L'{') && (cVar5 != L'}')) goto switchD_003f79b8_caseD_5e;
            }
          }
        }
      }
    }
    internalSetText(this,(QString *)(this + 0x18),-1,false);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetLineControl::parseInputMask(const QString &maskFields)
{
    qsizetype delimiter = maskFields.indexOf(u';');
    if (maskFields.isEmpty() || delimiter == 0) {
        if (m_maskData) {
            m_maskData.reset();
            m_maxLength = 32767;
            internalSetText(QString(), -1, false);
        }
        return;
    }

    if (delimiter == -1) {
        m_blank = u' ';
        m_inputMask = maskFields;
    } else {
        m_inputMask = maskFields.left(delimiter);
        m_blank = (delimiter + 1 < maskFields.size()) ? maskFields[delimiter + 1] : u' ';
    }

    // calculate m_maxLength / m_maskData length
    m_maxLength = 0;
    bool escaped = false;
    for (int i=0; i<m_inputMask.size(); i++) {
        const auto c = m_inputMask.at(i);
        if (escaped) {
           ++m_maxLength;
           escaped = false;
           continue;
        }

        if (c == u'\\') {
           escaped = true;
           continue;
        }

        if (c != u'\\' && c != u'!' && c != u'<' && c != u'>' &&
             c != u'{' && c != u'}' && c != u'[' && c != u']')
            m_maxLength++;
    }

    m_maskData = std::make_unique<MaskInputData[]>(m_maxLength);

    MaskInputData::Casemode m = MaskInputData::NoCaseMode;
    bool s;
    bool escape = false;
    int index = 0;
    for (int i = 0; i < m_inputMask.size(); i++) {
        const auto c = m_inputMask.at(i);
        if (escape) {
            s = true;
            m_maskData[index].maskChar = c;
            m_maskData[index].separator = s;
            m_maskData[index].caseMode = m;
            index++;
            escape = false;
        } else if (c == u'<') {
            m = MaskInputData::Lower;
        } else if (c == u'>') {
            m = MaskInputData::Upper;
        } else if (c == u'!') {
            m = MaskInputData::NoCaseMode;
        } else if (c != u'{' && c != u'}' && c != u'[' && c != u']') {
            switch (c.unicode()) {
            case 'A':
            case 'a':
            case 'N':
            case 'n':
            case 'X':
            case 'x':
            case '9':
            case '0':
            case 'D':
            case 'd':
            case '#':
            case 'H':
            case 'h':
            case 'B':
            case 'b':
                s = false;
                break;
            case '\\':
                escape = true;
                Q_FALLTHROUGH();
            default:
                s = true;
                break;
            }

            if (!escape) {
                m_maskData[index].maskChar = c;
                m_maskData[index].separator = s;
                m_maskData[index].caseMode = m;
                index++;
            }
        }
    }
    internalSetText(m_text, -1, false);
}